

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

ObjectSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  int *piVar1;
  undefined8 *puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  char cVar6;
  unsigned_long __i0;
  long lVar7;
  ulong uVar8;
  runtime_error *this_00;
  long lVar9;
  size_t sVar10;
  undefined1 *puVar11;
  ulong uVar12;
  size_t sVar13;
  uint *puVar14;
  uint uVar15;
  anon_class_16_2_f160e5ca *paVar16;
  undefined1 (*pauVar17) [16];
  undefined8 *puVar18;
  anon_class_16_2_f160e5ca *paVar19;
  undefined1 *puVar20;
  BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr___00;
  blocked_range<unsigned_long> *range;
  float fVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar28;
  uint uVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  uint uVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  undefined1 auVar35 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  uint uVar37;
  uint uVar38;
  float fVar39;
  uint uVar40;
  uint uVar41;
  float fVar42;
  float fVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  float fVar50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  float fVar51;
  float fVar52;
  BinMapping<32UL> mapping;
  task_group_context context;
  ObjectBinner binner;
  vfloat4 rAreas [32];
  task_group_context *in_stack_ffffffffffffe0c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1f10;
  ulong local_1f00;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ee0;
  undefined8 local_1ed0;
  anon_class_16_2_ed117de8_conflict5 local_1ec8;
  float local_1eb0;
  float fStack_1eac;
  float fStack_1ea8;
  float fStack_1ea4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ea0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e90;
  task_group_context local_1e80 [3];
  undefined1 auStack_1c90 [16];
  blocked_range<unsigned_long> local_1c80 [3];
  undefined8 local_1c30 [372];
  int aiStack_1090 [4];
  undefined8 local_1080;
  int aiStack_1078 [122];
  undefined8 uStack_e90;
  float afStack_e88 [2];
  undefined1 local_e80 [20];
  float afStack_e6c [763];
  undefined1 local_280 [592];
  
  lVar7 = 0xc00;
  puVar18 = local_1c30;
  do {
    puVar18[-2] = 0x7f8000007f800000;
    puVar18[-1] = 0x7f8000007f800000;
    *puVar18 = 0xff800000ff800000;
    puVar18[1] = 0xff800000ff800000;
    puVar18[-6] = 0x7f8000007f800000;
    puVar18[-5] = 0x7f8000007f800000;
    puVar18[-4] = 0xff800000ff800000;
    puVar18[-3] = 0xff800000ff800000;
    puVar18[-10] = 0x7f8000007f800000;
    puVar18[-9] = 0x7f8000007f800000;
    puVar18[-8] = 0xff800000ff800000;
    puVar18[-7] = 0xff800000ff800000;
    *(undefined8 *)((long)&local_1c80[0].my_end + lVar7) = 0;
    *(undefined8 *)((long)&local_1c80[0].my_begin + lVar7) = 0;
    lVar7 = lVar7 + 0x10;
    puVar18 = puVar18 + 0xc;
  } while (lVar7 != 0xe00);
  uVar3 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  fVar21 = (float)(uVar4 - uVar3) * 0.05 + 4.0;
  uVar8 = (ulong)fVar21;
  paVar16 = (anon_class_16_2_f160e5ca *)
            ((long)(fVar21 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8);
  local_1ec8.func = (anon_class_16_2_f160e5ca *)&DAT_00000020;
  if (paVar16 < (anon_class_16_2_f160e5ca *)&DAT_00000020) {
    local_1ec8.func = paVar16;
  }
  local_1ec8.reduction = (anon_class_8_1_a667e50d *)&local_1ec8.func;
  local_1eb0 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[0];
  fStack_1eac = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  fStack_1ea8 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[2];
  fStack_1ea4 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  auVar33._0_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - local_1eb0;
  auVar33._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fStack_1eac;
  auVar33._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fStack_1ea8;
  auVar33._12_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] - fStack_1ea4;
  auVar35 = maxps(_DAT_01f7bb10,auVar33);
  auVar32._0_4_ = (float)(long)local_1ec8.func * 0.99;
  auVar32._4_4_ = auVar32._0_4_;
  auVar32._8_4_ = auVar32._0_4_;
  auVar32._12_4_ = auVar32._0_4_;
  auVar33 = divps(auVar32,auVar35);
  local_1ea0.m128[0] = (float)(-(uint)((float)DAT_01f7bb10 < auVar35._0_4_) & auVar33._0_4_);
  local_1ea0.m128[1] = (float)(-(uint)(DAT_01f7bb10._4_4_ < auVar35._4_4_) & auVar33._4_4_);
  local_1ea0.m128[2] = (float)(-(uint)(DAT_01f7bb10._8_4_ < auVar35._8_4_) & auVar33._8_4_);
  local_1ea0.m128[3] = (float)(-(uint)(DAT_01f7bb10._12_4_ < auVar35._12_4_) & auVar33._12_4_);
  local_1e80[0].my_version = proxy_support;
  local_1e80[0].my_traits = (context_traits)0x4;
  local_1e80[0].my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_1e80[0].my_node.my_next_node = (intrusive_list_node *)0x0;
  local_1e80[0].my_name = CUSTOM_CTX;
  local_1e90._0_8_ = this;
  local_1e90._8_8_ = local_1ec8.reduction;
  tbb::detail::r1::initialize(local_1e80);
  local_1ee0._8_8_ = uVar3;
  local_1ee0._0_8_ = uVar4;
  local_1ed0 = 0x400;
  __return_storage_ptr___00 =
       (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80;
  range = local_1c80;
  local_1f10._0_8_ = &local_1ec8;
  local_1f10._8_8_ = &local_1e90;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::sse2::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::sse2::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long,embree::sse2::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::sse2::PrimInfoExtRange_const&,unsigned_long,embree::sse2::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::sse2::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&,embree::sse2::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::sse2::BinI___:Vec3fa>>const__embree__sse2__BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const___1_>
            (__return_storage_ptr___00,(d1 *)&local_1ee0.field_1,range,
             (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)&local_1f10.field_1,
             &local_1ec8,(anon_class_8_1_a667e50d *)local_1e80,in_stack_ffffffffffffe0c0);
  cVar6 = tbb::detail::r1::is_group_execution_cancelled(local_1e80);
  if (cVar6 == '\0') {
    tbb::detail::r1::destroy(local_1e80);
    lVar7 = 0;
    do {
      lVar9 = 0x10;
      do {
        puVar18 = (undefined8 *)((long)(__return_storage_ptr___00->_bounds + -1) + 0x50 + lVar9);
        uVar5 = puVar18[1];
        puVar2 = (undefined8 *)((long)range + lVar9 + -0x10);
        *puVar2 = *puVar18;
        puVar2[1] = uVar5;
        puVar2 = (undefined8 *)
                 ((long)&__return_storage_ptr___00->_bounds[0][0].lower.field_0 + lVar9);
        uVar5 = puVar2[1];
        puVar18 = (undefined8 *)((long)&range->my_end + lVar9);
        *puVar18 = *puVar2;
        puVar18[1] = uVar5;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x70);
      lVar7 = lVar7 + 1;
      __return_storage_ptr___00 =
           (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)
           (__return_storage_ptr___00->_bounds + 1);
      range = range + 4;
    } while (lVar7 != 0x20);
    memcpy(&local_1080,local_280,0x200);
    puVar11 = (undefined1 *)((long)&local_1ec8.func[-1]._mapping + 7);
    if (puVar11 != (undefined1 *)0x0) {
      lVar7 = (long)local_1ec8.func * 0x10;
      pauVar17 = (undefined1 (*) [16])(auStack_1c90 + (long)local_1ec8.func * 0x60);
      iVar22 = 0;
      iVar23 = 0;
      iVar24 = 0;
      iVar25 = 0;
      lVar9 = 0;
      puVar20 = puVar11;
      aVar27 = _DAT_01f7aa00;
      aVar31 = _DAT_01f7a9f0;
      aVar34 = _DAT_01f7aa00;
      aVar36 = _DAT_01f7a9f0;
      aVar48 = _DAT_01f7a9f0;
      aVar49 = _DAT_01f7aa00;
      do {
        piVar1 = (int *)((long)aiStack_1090 + lVar9 + lVar7);
        iVar22 = iVar22 + *piVar1;
        iVar23 = iVar23 + piVar1[1];
        iVar24 = iVar24 + piVar1[2];
        iVar25 = iVar25 + piVar1[3];
        piVar1 = (int *)((long)&local_1e90 + lVar9 + lVar7);
        *piVar1 = iVar22;
        piVar1[1] = iVar23;
        piVar1[2] = iVar24;
        piVar1[3] = iVar25;
        aVar48.m128 = (__m128)minps(aVar48.m128,pauVar17[-5]);
        aVar49.m128 = (__m128)maxps(aVar49.m128,pauVar17[-4]);
        fVar21 = aVar49.m128[1] - aVar48.m128[1];
        fVar39 = aVar49.m128[2] - aVar48.m128[2];
        aVar31.m128 = (__m128)minps(aVar31.m128,pauVar17[-3]);
        aVar27.m128 = (__m128)maxps(aVar27.m128,pauVar17[-2]);
        fVar42 = aVar27.m128[1] - aVar31.m128[1];
        fVar43 = aVar27.m128[2] - aVar31.m128[2];
        *(ulong *)((long)&uStack_e90 + lVar9 + lVar7) =
             CONCAT44((aVar27.m128[0] - aVar31.m128[0]) * (fVar42 + fVar43) + fVar43 * fVar42,
                      (aVar49.m128[0] - aVar48.m128[0]) * (fVar21 + fVar39) + fVar39 * fVar21);
        aVar36.m128 = (__m128)minps(aVar36.m128,pauVar17[-1]);
        aVar34.m128 = (__m128)maxps(aVar34.m128,*pauVar17);
        fVar21 = aVar34.m128[1] - aVar36.m128[1];
        fVar39 = aVar34.m128[2] - aVar36.m128[2];
        *(float *)((long)afStack_e88 + lVar9 + lVar7) =
             (fVar21 + fVar39) * (aVar34.m128[0] - aVar36.m128[0]) + fVar39 * fVar21;
        *(undefined4 *)((long)afStack_e88 + lVar9 + lVar7 + 4) = 0;
        lVar9 = lVar9 + -0x10;
        pauVar17 = pauVar17 + -6;
        puVar20 = puVar20 + -1;
      } while (puVar20 != (undefined1 *)0x0);
    }
    uVar8 = 0xffffffff;
    local_1ee0 = _DAT_01f7a9f0;
    if (local_1ec8.func < (anon_class_16_2_f160e5ca *)0x2) {
      local_1f10.m128[0] = (float)0;
      local_1f10.m128[1] = (float)0;
      local_1f10.m128[2] = (float)0;
      local_1f10.m128[3] = (float)0;
    }
    else {
      uVar15 = ~(-1 << ((byte)logBlockSize & 0x1f));
      uVar26 = 1;
      uVar28 = 1;
      uVar29 = 1;
      uVar30 = 1;
      iVar22 = 0;
      iVar23 = 0;
      iVar24 = 0;
      iVar25 = 0;
      pauVar17 = (undefined1 (*) [16])local_1c30;
      lVar7 = 0;
      local_1f10.m128[0] = (float)0;
      local_1f10.m128[1] = (float)0;
      local_1f10.m128[2] = (float)0;
      local_1f10.m128[3] = (float)0;
      aVar27 = _DAT_01f7aa00;
      aVar31 = _DAT_01f7a9f0;
      aVar34 = _DAT_01f7aa00;
      aVar36 = _DAT_01f7aa00;
      aVar48 = _DAT_01f7a9f0;
      aVar49 = _DAT_01f7a9f0;
      do {
        aVar31.m128 = (__m128)minps(aVar31.m128,pauVar17[-5]);
        aVar27.m128 = (__m128)maxps(aVar27.m128,pauVar17[-4]);
        aVar48.m128 = (__m128)minps(aVar48.m128,pauVar17[-3]);
        aVar36.m128 = (__m128)maxps(aVar36.m128,pauVar17[-2]);
        fVar51 = aVar27.m128[1] - aVar31.m128[1];
        fVar52 = aVar27.m128[2] - aVar31.m128[2];
        aVar49.m128 = (__m128)minps(aVar49.m128,pauVar17[-1]);
        fVar21 = aVar36.m128[1] - aVar48.m128[1];
        fVar39 = aVar36.m128[2] - aVar48.m128[2];
        aVar34.m128 = (__m128)maxps(aVar34.m128,*pauVar17);
        fVar42 = aVar34.m128[0] - aVar49.m128[0];
        fVar43 = aVar34.m128[1] - aVar49.m128[1];
        fVar50 = aVar34.m128[2] - aVar49.m128[2];
        iVar22 = iVar22 + *(int *)((long)&local_1080 + lVar7);
        iVar23 = iVar23 + *(int *)((long)&local_1080 + lVar7 + 4);
        iVar24 = iVar24 + *(int *)((long)aiStack_1078 + lVar7);
        iVar25 = iVar25 + *(int *)((long)aiStack_1078 + lVar7 + 4);
        local_1f00 = logBlockSize & 0xffffffff;
        uVar37 = iVar22 + uVar15 >> local_1f00;
        uVar38 = iVar23 + uVar15 >> local_1f00;
        uVar40 = iVar24 + uVar15 >> local_1f00;
        uVar41 = iVar25 + uVar15 >> local_1f00;
        uVar44 = *(int *)(local_1e80[0].padding + lVar7 + -0x38) + uVar15 >> local_1f00;
        uVar45 = *(int *)(local_1e80[0].padding + lVar7 + -0x34) + uVar15 >> local_1f00;
        uVar46 = *(int *)(local_1e80[0].padding + lVar7 + -0x30) + uVar15 >> local_1f00;
        uVar47 = *(int *)(local_1e80[0].padding + lVar7 + -0x2c) + uVar15 >> local_1f00;
        auVar35._0_4_ =
             ((float)(uVar44 & 0x7fffffff) + (float)((int)uVar44 >> 0x1f & 0x4f000000)) *
             *(float *)(local_e80 + lVar7 + 0x10) +
             ((float)(uVar37 & 0x7fffffff) + (float)((int)uVar37 >> 0x1f & 0x4f000000)) *
             ((aVar27.m128[0] - aVar31.m128[0]) * (fVar51 + fVar52) + fVar52 * fVar51);
        auVar35._4_4_ =
             ((float)(uVar45 & 0x7fffffff) + (float)((int)uVar45 >> 0x1f & 0x4f000000)) *
             *(float *)((long)afStack_e6c + lVar7) +
             ((float)(uVar38 & 0x7fffffff) + (float)((int)uVar38 >> 0x1f & 0x4f000000)) *
             ((aVar36.m128[0] - aVar48.m128[0]) * (fVar21 + fVar39) + fVar39 * fVar21);
        auVar35._8_4_ =
             ((float)(uVar46 & 0x7fffffff) + (float)((int)uVar46 >> 0x1f & 0x4f000000)) *
             *(float *)((long)afStack_e6c + lVar7 + 4) +
             ((float)(uVar40 & 0x7fffffff) + (float)((int)uVar40 >> 0x1f & 0x4f000000)) *
             (fVar42 * (fVar50 + fVar43) + fVar43 * fVar50);
        auVar35._12_4_ =
             ((float)(uVar47 & 0x7fffffff) + (float)((int)uVar47 >> 0x1f & 0x4f000000)) *
             *(float *)((long)afStack_e6c + lVar7 + 8) +
             ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
             (fVar42 * (fVar43 + fVar50) + fVar50 * fVar43);
        uVar37 = -(uint)(local_1ee0.m128[0] <= auVar35._0_4_);
        uVar38 = -(uint)(local_1ee0.m128[1] <= auVar35._4_4_);
        uVar40 = -(uint)(local_1ee0.m128[2] <= auVar35._8_4_);
        uVar41 = -(uint)(local_1ee0.m128[3] <= auVar35._12_4_);
        local_1f10.m128[0] = (float)(~uVar37 & uVar26 | (uint)local_1f10.m128[0] & uVar37);
        local_1f10.m128[1] = (float)(~uVar38 & uVar28 | (uint)local_1f10.m128[1] & uVar38);
        local_1f10.m128[2] = (float)(~uVar40 & uVar29 | (uint)local_1f10.m128[2] & uVar40);
        local_1f10.m128[3] = (float)(~uVar41 & uVar30 | (uint)local_1f10.m128[3] & uVar41);
        local_1ee0.m128 = (__m128)minps(auVar35,local_1ee0.m128);
        uVar26 = uVar26 + 1;
        uVar28 = uVar28 + 1;
        uVar29 = uVar29 + 1;
        uVar30 = uVar30 + 1;
        pauVar17 = pauVar17 + 6;
        lVar7 = lVar7 + 0x10;
        puVar11 = puVar11 + -1;
      } while (puVar11 != (undefined1 *)0x0);
    }
    fVar21 = INFINITY;
    uVar12 = 0;
    iVar22 = 0;
    do {
      fVar39 = *(float *)((long)&local_1ea0 + uVar12 * 4);
      if ((((fVar39 != 0.0) || (NAN(fVar39))) &&
          (fVar39 = *(float *)((long)&local_1ee0 + uVar12 * 4), fVar39 < fVar21)) &&
         (iVar23 = *(int *)((long)&local_1f10 + uVar12 * 4), iVar23 != 0)) {
        uVar8 = uVar12 & 0xffffffff;
        iVar22 = iVar23;
        fVar21 = fVar39;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 3);
    __return_storage_ptr__->sah = fVar21;
    iVar23 = (int)uVar8;
    __return_storage_ptr__->dim = iVar23;
    (__return_storage_ptr__->field_2).pos = iVar22;
    __return_storage_ptr__->data = 0;
    (__return_storage_ptr__->mapping).num = (size_t)local_1ec8.func;
    *(ulong *)&(__return_storage_ptr__->mapping).ofs.field_0 = CONCAT44(fStack_1eac,local_1eb0);
    *(ulong *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
         CONCAT44(fStack_1ea4,fStack_1ea8);
    *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 =
         CONCAT44(local_1ea0.m128[1],local_1ea0.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
         CONCAT44(local_1ea0.m128[3],local_1ea0.m128[2]);
    if (iVar23 == -1) {
      info->leftCount = 0;
      info->rightCount = 0;
      aVar27 = _DAT_01f7a9f0;
      (info->leftBounds).lower.field_0 = _DAT_01f7a9f0;
      aVar31 = _DAT_01f7aa00;
      aVar34 = _DAT_01f7aa00;
    }
    else {
      paVar16 = (anon_class_16_2_f160e5ca *)(long)iVar22;
      lVar7 = (long)iVar23;
      aVar34 = _DAT_01f7aa00;
      aVar36 = _DAT_01f7a9f0;
      if (iVar22 == 0) {
        sVar10 = 0;
      }
      else {
        puVar14 = (uint *)((long)&local_1080 + lVar7 * 4);
        pauVar17 = (undefined1 (*) [16])((long)local_1c80 + lVar7 * 0x20 + 0x10);
        sVar10 = 0;
        paVar19 = paVar16;
        do {
          aVar36.m128 = (__m128)minps(aVar36.m128,pauVar17[-1]);
          aVar34.m128 = (__m128)maxps(aVar34.m128,*pauVar17);
          sVar10 = sVar10 + *puVar14;
          puVar14 = puVar14 + 4;
          pauVar17 = pauVar17 + 6;
          paVar19 = (anon_class_16_2_f160e5ca *)((long)&paVar19[-1]._mapping + 7);
        } while (paVar19 != (anon_class_16_2_f160e5ca *)0x0);
      }
      lVar9 = (long)local_1ec8.func - (long)paVar16;
      aVar27 = _DAT_01f7a9f0;
      aVar31 = _DAT_01f7aa00;
      if (local_1ec8.func < paVar16 || lVar9 == 0) {
        sVar13 = 0;
      }
      else {
        puVar14 = (uint *)((long)&local_1080 + (long)paVar16 * 0x10 + lVar7 * 4);
        pauVar17 = (undefined1 (*) [16])
                   ((long)local_1c80 + lVar7 * 0x20 + (long)paVar16 * 0x60 + 0x10);
        sVar13 = 0;
        do {
          aVar27.m128 = (__m128)minps(aVar27.m128,pauVar17[-1]);
          aVar31.m128 = (__m128)maxps(aVar31.m128,*pauVar17);
          sVar13 = sVar13 + *puVar14;
          puVar14 = puVar14 + 4;
          pauVar17 = pauVar17 + 6;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      info->leftCount = sVar10;
      info->rightCount = sVar13;
      (info->leftBounds).lower.field_0 = aVar36;
    }
    (info->leftBounds).upper.field_0 = aVar34;
    (info->rightBounds).lower.field_0 = aVar27;
    (info->rightBounds).upper.field_0 = aVar31;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty);
          const BinMapping<OBJECT_BINS> mapping(set);
          const BinMapping<OBJECT_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> ObjectBinner { ObjectBinner binner(empty); binner.bin(prims0+r.begin(),r.size(),_mapping); return binner; },
                                   [&] (const ObjectBinner& b0, const ObjectBinner& b1) -> ObjectBinner { ObjectBinner r = b0; r.merge(b1,_mapping.size()); return r; });
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }